

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  pointer pbVar1;
  float fVar2;
  undefined8 uVar3;
  undefined1 auVar4 [8];
  pointer pfVar5;
  byte bVar6;
  Error EVar7;
  OptionAdder *pOVar8;
  size_t sVar9;
  OptionValue *pOVar10;
  FILE *pFVar11;
  size_type sVar12;
  ostream *poVar13;
  byte bVar14;
  int iVar15;
  char cVar16;
  long *plVar17;
  char *pcVar18;
  int iVar19;
  _Head_base<0UL,_wave::File::Impl_*,_false> *this;
  uint uVar20;
  __hashtable *__h;
  ulong uVar21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar22;
  pointer pbVar23;
  long lVar24;
  long lVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  File read_file;
  string name;
  string output_file;
  string input_file;
  ParseResult result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  vector<float,_std::allocator<float>_> content;
  undefined1 local_7d8 [47];
  undefined1 local_7a9;
  string local_7a8;
  undefined1 local_788 [16];
  undefined1 local_778 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_768;
  undefined1 local_758 [32];
  _Alloc_hider local_738;
  size_type local_730;
  undefined1 auStack_728 [16];
  _Alloc_hider _Stack_718;
  __node_base local_710;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_708;
  size_t local_6f8;
  element_type *peStack_6f0;
  string local_6e8;
  string local_6c8;
  uint *local_6a8;
  pointer local_6a0;
  uint local_698;
  undefined4 uStack_694;
  undefined1 auStack_690 [8];
  _Head_base<0UL,_wave::File::Impl_*,_false> local_688;
  _Base_ptr local_680;
  _Base_ptr local_678 [2];
  string local_668;
  string local_648;
  string local_628;
  string local_608;
  string local_5e8;
  undefined1 local_5c8 [20];
  undefined4 uStack_5b4;
  undefined4 uStack_5b0;
  undefined4 uStack_5ac;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_590;
  vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> local_558;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_540;
  string local_528;
  string local_508;
  string local_4e8;
  string local_4c8;
  string local_4a8;
  string local_488;
  string local_468;
  string local_448;
  string local_428;
  string local_408;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  string local_388;
  shared_ptr<const_cxxopts::Value> local_368;
  shared_ptr<const_cxxopts::Value> local_358;
  shared_ptr<const_cxxopts::Value> local_348;
  float local_338 [2];
  undefined4 uStack_330;
  undefined4 uStack_32c;
  shared_ptr<const_cxxopts::Value> local_328;
  shared_ptr<const_cxxopts::Value> local_318;
  shared_ptr<const_cxxopts::Value> local_308;
  shared_ptr<const_cxxopts::Value> local_2f8;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  undefined4 local_268;
  undefined4 uStack_264;
  undefined4 uStack_260;
  undefined4 uStack_25c;
  long *local_258 [2];
  long local_248 [2];
  undefined1 local_238 [8];
  pointer pfStack_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  byte abStack_218 [64];
  string local_1d8 [32];
  bool local_1b8;
  bool local_1b7;
  Impl *local_1b0;
  pointer local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_198;
  pointer local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188 [10];
  
  local_648._M_dataplus._M_p = (pointer)&local_648.field_2;
  local_648._M_string_length = 0;
  local_648.field_2._M_local_buf[0] = '\0';
  local_668._M_dataplus._M_p = (pointer)&local_668.field_2;
  local_668._M_string_length = 0;
  local_668.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_688,*argv,(allocator *)local_238);
  std::__cxx11::string::string
            ((string *)&local_288,(char *)local_688._M_head_impl,(allocator *)local_788);
  local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_488,local_688._M_head_impl,
             (long)&local_680->_M_color + (long)local_688._M_head_impl);
  std::__cxx11::string::append((char *)&local_488);
  cxxopts::Options::Options((Options *)local_238,&local_288,&local_488);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488._M_dataplus._M_p != &local_488.field_2) {
    operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  local_258[0] = local_248;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"[optional args]","");
  std::__cxx11::string::operator=((string *)(local_238 + 0x60),(string *)local_258);
  local_1b8 = true;
  if (local_258[0] != local_248) {
    operator_delete(local_258[0],local_248[0] + 1);
  }
  local_1b7 = true;
  local_6a8 = &local_698;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a8,"");
  uVar20 = local_698;
  local_778._0_8_ = local_6a0;
  if (local_6a8 == &local_698) {
    uStack_5b0 = auStack_690._0_4_;
    uStack_5ac = auStack_690._4_4_;
    local_6a8 = (uint *)(local_5c8 + 0x10);
  }
  uStack_5b4 = uStack_694;
  local_5c8._16_4_ = local_698;
  local_6a0 = (pointer)0x0;
  local_698 = local_698 & 0xffffff00;
  local_788._8_8_ = local_778 + 8;
  if (local_6a8 == (uint *)(local_5c8 + 0x10)) {
    local_778._8_8_ = CONCAT44(uStack_694,uVar20);
    aStack_768._4_4_ = uStack_5ac;
    aStack_768._0_4_ = uStack_5b0;
  }
  else {
    local_778._8_8_ = stack0xfffffffffffffa48;
    local_788._8_8_ = local_6a8;
  }
  local_5c8._0_8_ = local_5c8 + 0x10;
  local_788._0_8_ = (Impl *)local_238;
  local_6a8 = &local_698;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5c8,"i,input","");
  local_7d8._0_8_ = local_7d8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7d8,"Input","");
  std::
  __shared_ptr<cxxopts::values::standard_value<std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<std::__cxx11::string>>>
            ((__shared_ptr<cxxopts::values::standard_value<std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>
              *)&local_7a8,
             (allocator<cxxopts::values::standard_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_6c8);
  local_2f8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
       local_7a8._M_dataplus._M_p._0_4_;
  local_2f8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       local_7a8._M_dataplus._M_p._4_4_;
  local_2f8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _0_4_ = (undefined4)local_7a8._M_string_length;
  local_2f8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = local_7a8._M_string_length._4_4_;
  local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"");
  pOVar8 = cxxopts::OptionAdder::operator()
                     ((OptionAdder *)local_788,(string *)local_5c8,(string *)local_7d8,&local_2f8,
                      &local_388);
  local_7a8._M_dataplus._M_p = (pointer)&local_7a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a8,"o,output","");
  local_6c8._M_dataplus._M_p = (pointer)&local_6c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6c8,"Output file","");
  std::
  __shared_ptr<cxxopts::values::standard_value<std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<std::__cxx11::string>>>
            ((__shared_ptr<cxxopts::values::standard_value<std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>
              *)&local_6e8,
             (allocator<cxxopts::values::standard_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_4a8);
  local_308.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
       local_6e8._M_dataplus._M_p._0_4_;
  local_308.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       local_6e8._M_dataplus._M_p._4_4_;
  local_308.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _0_4_ = (undefined4)local_6e8._M_string_length;
  local_308.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = local_6e8._M_string_length._4_4_;
  local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"");
  pOVar8 = cxxopts::OptionAdder::operator()(pOVar8,&local_7a8,&local_6c8,&local_308,&local_3a8);
  local_6e8._M_dataplus._M_p = (pointer)&local_6e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6e8,"tap","");
  local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"Convert WAV to TAP","");
  std::__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<bool>>>
            ((__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2> *)
             &local_5e8,(allocator<cxxopts::values::standard_value<bool>_> *)&local_4c8);
  local_318.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
       local_5e8._M_dataplus._M_p._0_4_;
  local_318.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       local_5e8._M_dataplus._M_p._4_4_;
  local_318.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _0_4_ = (undefined4)local_5e8._M_string_length;
  local_318.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = local_5e8._M_string_length._4_4_;
  local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"");
  pOVar8 = cxxopts::OptionAdder::operator()(pOVar8,&local_6e8,&local_4a8,&local_318,&local_3c8);
  local_5e8._M_dataplus._M_p = (pointer)&local_5e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5e8,"oldtap","");
  local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c8,"Convert WAV to oldTAP","");
  std::__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<bool>>>
            ((__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2> *)
             &local_608,(allocator<cxxopts::values::standard_value<bool>_> *)&local_4e8);
  local_328.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
       local_608._M_dataplus._M_p._0_4_;
  local_328.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       local_608._M_dataplus._M_p._4_4_;
  local_328.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _0_4_ = (undefined4)local_608._M_string_length;
  local_328.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = local_608._M_string_length._4_4_;
  local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"");
  pOVar8 = cxxopts::OptionAdder::operator()(pOVar8,&local_5e8,&local_4c8,&local_328,&local_3e8);
  local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_608,"wav","");
  local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e8,"Convert TAP to WAV","");
  std::__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<bool>>>
            ((__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2> *)
             &local_628,(allocator<cxxopts::values::standard_value<bool>_> *)&local_508);
  local_338[0] = local_628._M_dataplus._M_p._0_4_;
  local_338[1] = (float)local_628._M_dataplus._M_p._4_4_;
  uStack_330 = (undefined4)local_628._M_string_length;
  uStack_32c = local_628._M_string_length._4_4_;
  local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"");
  pOVar8 = cxxopts::OptionAdder::operator()
                     (pOVar8,&local_608,&local_4e8,(shared_ptr<const_cxxopts::Value> *)local_338,
                      &local_408);
  local_628._M_dataplus._M_p = (pointer)&local_628.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_628,"old2new","");
  local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_508,"Convert old TAP to new TAP","");
  std::__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<bool>>>
            ((__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2> *)
             &local_448,(allocator<cxxopts::values::standard_value<bool>_> *)&local_2e8);
  local_348.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
       local_448._M_dataplus._M_p._0_4_;
  local_348.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       local_448._M_dataplus._M_p._4_4_;
  local_348.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _0_4_ = (undefined4)local_448._M_string_length;
  local_348.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = local_448._M_string_length._4_4_;
  local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"");
  pOVar8 = cxxopts::OptionAdder::operator()(pOVar8,&local_628,&local_508,&local_348,&local_428);
  local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"new2old","");
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2e8,"Convert new TAP to old TAP <WARNING: header will not be good>",""
            );
  std::__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<bool>>>
            ((__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2> *)
             &local_468,(allocator<cxxopts::values::standard_value<bool>_> *)&local_528);
  local_358.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
       local_468._M_dataplus._M_p._0_4_;
  local_358.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       local_468._M_dataplus._M_p._4_4_;
  local_358.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _0_4_ = (undefined4)local_468._M_string_length;
  local_358.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = local_468._M_string_length._4_4_;
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"");
  pOVar8 = cxxopts::OptionAdder::operator()(pOVar8,&local_448,&local_2e8,&local_358,&local_2a8);
  local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"help","");
  local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_528,"Print help","");
  std::__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<bool>>>
            ((__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2> *)
             &local_268,(allocator<cxxopts::values::standard_value<bool>_> *)&local_7a9);
  local_368.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
       local_268;
  local_368.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       uStack_264;
  local_368.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _0_4_ = uStack_260;
  local_368.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = uStack_25c;
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"");
  cxxopts::OptionAdder::operator()(pOVar8,&local_468,&local_528,&local_368,&local_2c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT44(local_368.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_,
               local_368.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._0_4_) != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(local_368.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._4_4_,
                        local_368.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._0_4_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_528._M_dataplus._M_p != &local_528.field_2) {
    operator_delete(local_528._M_dataplus._M_p,local_528.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_dataplus._M_p != &local_468.field_2) {
    operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT44(local_358.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_,
               local_358.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._0_4_) != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(local_358.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._4_4_,
                        local_358.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._0_4_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  pbVar1 = (pointer)(local_7d8 + 0x10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != &local_448.field_2) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428._M_dataplus._M_p != &local_428.field_2) {
    operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT44(local_348.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_,
               local_348.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._0_4_) != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(local_348.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._4_4_,
                        local_348.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._0_4_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._M_dataplus._M_p != &local_508.field_2) {
    operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_628._M_dataplus._M_p != &local_628.field_2) {
    operator_delete(local_628._M_dataplus._M_p,local_628.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._M_dataplus._M_p != &local_408.field_2) {
    operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_32c,uStack_330) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_32c,uStack_330));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
    operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_608._M_dataplus._M_p != &local_608.field_2) {
    operator_delete(local_608._M_dataplus._M_p,local_608.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
    operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT44(local_328.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_,
               local_328.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._0_4_) != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(local_328.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._4_4_,
                        local_328.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._0_4_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
    operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
    operator_delete(local_5e8._M_dataplus._M_p,local_5e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT44(local_318.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_,
               local_318.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._0_4_) != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(local_318.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._4_4_,
                        local_318.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._0_4_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
    operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e8._M_dataplus._M_p != &local_6e8.field_2) {
    operator_delete(local_6e8._M_dataplus._M_p,local_6e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT44(local_308.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_,
               local_308.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._0_4_) != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(local_308.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._4_4_,
                        local_308.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._0_4_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c8._M_dataplus._M_p != &local_6c8.field_2) {
    operator_delete(local_6c8._M_dataplus._M_p,local_6c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
    operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT44(local_2f8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_,
               local_2f8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._0_4_) != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(local_2f8.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._4_4_,
                        local_2f8.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._0_4_));
  }
  if ((pointer)local_7d8._0_8_ != pbVar1) {
    operator_delete((void *)local_7d8._0_8_,(ulong)(local_7d8._16_8_ + 1));
  }
  if ((undefined1 *)local_5c8._0_8_ != local_5c8 + 0x10) {
    operator_delete((void *)local_5c8._0_8_,stack0xfffffffffffffa48 + 1);
  }
  if ((undefined1 *)local_788._8_8_ != local_778 + 8) {
    operator_delete((void *)local_788._8_8_,local_778._8_8_ + 1);
  }
  if (local_6a8 != &local_698) {
    operator_delete(local_6a8,CONCAT44(uStack_694,local_698) + 1);
  }
  local_788._0_8_ = local_778;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_788,"input","");
  plVar17 = (long *)local_758;
  aStack_768._M_allocated_capacity = (size_type)plVar17;
  std::__cxx11::string::_M_construct<char_const*>((string *)&aStack_768,"output","");
  __l._M_len = 2;
  __l._M_array = (iterator)local_788;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_7d8,__l,(allocator_type *)&local_7a8);
  unique0x10003703 = local_190;
  local_5c8._8_8_ = pbStack_198;
  local_190 = (pointer)local_7d8._16_8_;
  local_1a0 = (pointer)local_7d8._0_8_;
  pbStack_198 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7d8._8_8_
  ;
  local_7d8._0_8_ = (pointer)0x0;
  local_7d8._8_8_ = (pointer)0x0;
  local_7d8._16_8_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_5c8);
  pbVar22 = pbStack_198;
  local_5c8._0_8_ = local_188;
  if (local_1a0 != pbStack_198) {
    pbVar23 = local_1a0;
    do {
      std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<std::__cxx11::string&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)local_188,pbVar23,local_5c8);
      pbVar23 = pbVar23 + 1;
    } while (pbVar23 != pbVar22);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_7d8);
  lVar24 = -0x40;
  do {
    if (plVar17 != (long *)plVar17[-2]) {
      operator_delete((long *)plVar17[-2],*plVar17 + 1);
    }
    plVar17 = plVar17 + -4;
    lVar24 = lVar24 + 0x20;
  } while (lVar24 != 0);
  local_758._0_8_ = auStack_728;
  local_788._0_8_ = local_1b0;
  local_778._0_8_ = (pointer)0x0;
  local_778._8_8_ = 0;
  aStack_768._0_8_ = 0;
  aStack_768._M_local_buf[8] = local_1b7;
  local_758._8_8_ = 1;
  local_758._16_8_ = 0;
  local_758._24_8_ = 0;
  local_738._M_p = (pointer)0x3f800000;
  auStack_728._8_8_ = &peStack_6f0;
  local_730 = 0;
  auStack_728._0_8_ = 0;
  _Stack_718._M_p = (pointer)0x1;
  local_710._M_nxt = (_Hash_node_base *)0x0;
  aStack_708._M_allocated_capacity = 0;
  aStack_708._8_8_ = 0x3f800000;
  local_6f8 = 0;
  peStack_6f0 = (element_type *)0x0;
  local_788._8_8_ = &local_1a0;
  cxxopts::OptionParser::parse((ParseResult *)local_5c8,(OptionParser *)local_788,argc,argv);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(auStack_728 + 8));
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_758);
  std::vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>::~vector
            ((vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *)local_778);
  local_788._0_8_ = (Impl *)local_778;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_788,"help","");
  sVar9 = cxxopts::ParseResult::count((ParseResult *)local_5c8,(string *)local_788);
  if (sVar9 != 0) {
    if ((Impl *)local_788._0_8_ != (Impl *)local_778) {
      operator_delete((void *)local_788._0_8_,(ulong)(local_778._0_8_ + 1));
    }
LAB_00108c13:
    local_7d8._0_8_ = (pointer)0x0;
    local_7d8._8_8_ = (pointer)0x0;
    local_7d8._16_8_ = 0;
    cxxopts::Options::help
              ((string *)local_788,(Options *)local_238,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_7d8);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(char *)local_788._0_8_,local_788._8_8_);
    std::endl<char,std::char_traits<char>>(poVar13);
    std::__cxx11::string::~string((string *)local_788);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_7d8);
    exit(0);
  }
  if ((Impl *)local_788._0_8_ != (Impl *)local_778) {
    operator_delete((void *)local_788._0_8_,(ulong)(local_778._0_8_ + 1));
  }
  if (local_558.super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_558.super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>._M_impl.
      super__Vector_impl_data._M_finish) goto LAB_00108c13;
  local_788._0_8_ = (Impl *)local_778;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_788,"input","");
  sVar9 = cxxopts::ParseResult::count((ParseResult *)local_5c8,(string *)local_788);
  if ((Impl *)local_788._0_8_ != (Impl *)local_778) {
    operator_delete((void *)local_788._0_8_,(ulong)(local_778._0_8_ + 1));
  }
  if (sVar9 == 0) {
    lVar24 = 0x18;
    pcVar18 = "Input file is mandatory.";
LAB_00107ea8:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar18,lVar24);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x58);
    std::ostream::put(-0x58);
    std::ostream::flush();
    uVar20 = 1;
    bVar31 = false;
    bVar30 = false;
    bVar27 = false;
    bVar29 = false;
    bVar28 = false;
    bVar26 = false;
  }
  else {
    local_788._0_8_ = (Impl *)local_778;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_788,"input","");
    pOVar10 = cxxopts::ParseResult::operator[]((ParseResult *)local_5c8,(string *)local_788);
    cxxopts::OptionValue::as<std::__cxx11::string>(pOVar10);
    std::__cxx11::string::_M_assign((string *)&local_648);
    if ((Impl *)local_788._0_8_ != (Impl *)local_778) {
      operator_delete((void *)local_788._0_8_,(ulong)(local_778._0_8_ + 1));
    }
    local_788._0_8_ = (Impl *)local_778;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_788,"output","");
    sVar9 = cxxopts::ParseResult::count((ParseResult *)local_5c8,(string *)local_788);
    if ((Impl *)local_788._0_8_ != (Impl *)local_778) {
      operator_delete((void *)local_788._0_8_,(ulong)(local_778._0_8_ + 1));
    }
    if (sVar9 == 0) {
      lVar24 = 0x19;
      pcVar18 = "Output file is mandatory.";
      goto LAB_00107ea8;
    }
    local_788._0_8_ = (Impl *)local_778;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_788,"output","");
    pOVar10 = cxxopts::ParseResult::operator[]((ParseResult *)local_5c8,(string *)local_788);
    cxxopts::OptionValue::as<std::__cxx11::string>(pOVar10);
    std::__cxx11::string::_M_assign((string *)&local_668);
    if ((Impl *)local_788._0_8_ != (Impl *)local_778) {
      operator_delete((void *)local_788._0_8_,(ulong)(local_778._0_8_ + 1));
    }
    local_788._0_8_ = (Impl *)local_778;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_788,"wav","");
    sVar9 = cxxopts::ParseResult::count((ParseResult *)local_5c8,(string *)local_788);
    if (sVar9 == 0) {
      bVar26 = false;
    }
    else {
      local_7d8._0_8_ = pbVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_7d8,"tap","");
      sVar9 = cxxopts::ParseResult::count((ParseResult *)local_5c8,(string *)local_7d8);
      if (sVar9 == 0) {
        bVar26 = false;
      }
      else {
        local_7a8._M_dataplus._M_p = (pointer)&local_7a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a8,"old2new","");
        sVar9 = cxxopts::ParseResult::count((ParseResult *)local_5c8,&local_7a8);
        if (sVar9 == 0) {
          bVar26 = false;
        }
        else {
          local_6c8._M_dataplus._M_p = (pointer)&local_6c8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_6c8,"new2old","");
          sVar9 = cxxopts::ParseResult::count((ParseResult *)local_5c8,&local_6c8);
          if (sVar9 == 0) {
            bVar26 = false;
          }
          else {
            local_6e8._M_dataplus._M_p = (pointer)&local_6e8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_6e8,"oldtap","");
            sVar9 = cxxopts::ParseResult::count((ParseResult *)local_5c8,&local_6e8);
            bVar26 = sVar9 != 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_6e8._M_dataplus._M_p != &local_6e8.field_2) {
              operator_delete(local_6e8._M_dataplus._M_p,local_6e8.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6c8._M_dataplus._M_p != &local_6c8.field_2) {
            operator_delete(local_6c8._M_dataplus._M_p,local_6c8.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
          operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
        }
      }
      if ((pointer)local_7d8._0_8_ != pbVar1) {
        operator_delete((void *)local_7d8._0_8_,local_7d8._16_8_ + 1);
      }
    }
    if ((Impl *)local_788._0_8_ != (Impl *)local_778) {
      operator_delete((void *)local_788._0_8_,(ulong)(local_778._0_8_ + 1));
    }
    if (bVar26) {
      lVar24 = 0x23;
      pcVar18 = "Only one target format is possible.";
      goto LAB_00107ea8;
    }
    local_788._0_8_ = (Impl *)local_778;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_788,"wav","");
    sVar9 = cxxopts::ParseResult::count((ParseResult *)local_5c8,(string *)local_788);
    if (sVar9 == 0) {
      local_7d8._0_8_ = pbVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_7d8,"tap","");
      sVar9 = cxxopts::ParseResult::count((ParseResult *)local_5c8,(string *)local_7d8);
      if (sVar9 == 0) {
        local_7a8._M_dataplus._M_p = (pointer)&local_7a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a8,"old2new","");
        sVar9 = cxxopts::ParseResult::count((ParseResult *)local_5c8,&local_7a8);
        if (sVar9 == 0) {
          local_6c8._M_dataplus._M_p = (pointer)&local_6c8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_6c8,"new2old","");
          sVar9 = cxxopts::ParseResult::count((ParseResult *)local_5c8,&local_6c8);
          if (sVar9 == 0) {
            local_6e8._M_dataplus._M_p = (pointer)&local_6e8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_6e8,"oldtap","");
            sVar9 = cxxopts::ParseResult::count((ParseResult *)local_5c8,&local_6e8);
            bVar26 = sVar9 == 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_6e8._M_dataplus._M_p != &local_6e8.field_2) {
              operator_delete(local_6e8._M_dataplus._M_p,local_6e8.field_2._M_allocated_capacity + 1
                             );
            }
          }
          else {
            bVar26 = false;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6c8._M_dataplus._M_p != &local_6c8.field_2) {
            operator_delete(local_6c8._M_dataplus._M_p,local_6c8.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          bVar26 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
          operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        bVar26 = false;
      }
      if ((pointer)local_7d8._0_8_ != pbVar1) {
        operator_delete((void *)local_7d8._0_8_,local_7d8._16_8_ + 1);
      }
    }
    else {
      bVar26 = false;
    }
    if ((Impl *)local_788._0_8_ != (Impl *)local_778) {
      operator_delete((void *)local_788._0_8_,(ulong)(local_778._0_8_ + 1));
    }
    if (bVar26) {
      lVar24 = 0x1b;
      pcVar18 = "Target format is mandatory.";
      goto LAB_00107ea8;
    }
    local_788._0_8_ = (Impl *)local_778;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_788,"wav","");
    sVar9 = cxxopts::ParseResult::count((ParseResult *)local_5c8,(string *)local_788);
    bVar27 = sVar9 != 0;
    if ((Impl *)local_788._0_8_ != (Impl *)local_778) {
      operator_delete((void *)local_788._0_8_,(ulong)(local_778._0_8_ + 1));
    }
    local_788._0_8_ = (Impl *)local_778;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_788,"tap","");
    sVar9 = cxxopts::ParseResult::count((ParseResult *)local_5c8,(string *)local_788);
    bVar28 = sVar9 != 0;
    if ((Impl *)local_788._0_8_ != (Impl *)local_778) {
      operator_delete((void *)local_788._0_8_,(ulong)(local_778._0_8_ + 1));
    }
    local_788._0_8_ = (Impl *)local_778;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_788,"oldtap","");
    sVar9 = cxxopts::ParseResult::count((ParseResult *)local_5c8,(string *)local_788);
    bVar29 = sVar9 != 0;
    if ((Impl *)local_788._0_8_ != (Impl *)local_778) {
      operator_delete((void *)local_788._0_8_,(ulong)(local_778._0_8_ + 1));
    }
    local_788._0_8_ = (Impl *)local_778;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_788,"old2new","");
    sVar9 = cxxopts::ParseResult::count((ParseResult *)local_5c8,(string *)local_788);
    bVar30 = sVar9 != 0;
    if ((Impl *)local_788._0_8_ != (Impl *)local_778) {
      operator_delete((void *)local_788._0_8_,(ulong)(local_778._0_8_ + 1));
    }
    local_788._0_8_ = (Impl *)local_778;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_788,"new2old","");
    sVar9 = cxxopts::ParseResult::count((ParseResult *)local_5c8,(string *)local_788);
    bVar31 = sVar9 != 0;
    if ((Impl *)local_788._0_8_ != (Impl *)local_778) {
      operator_delete((void *)local_788._0_8_,(ulong)(local_778._0_8_ + 1));
    }
    uVar20 = 0;
    bVar26 = true;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_540);
  std::vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>::~vector(&local_558);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_590);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_5c8);
  cxxopts::Options::~Options((Options *)local_238);
  if (local_688._M_head_impl != (Impl *)local_678) {
    operator_delete(local_688._M_head_impl,(ulong)((long)&local_678[0]->_M_color + 1));
  }
  if (!bVar26) goto LAB_001086bf;
  if (bVar28) {
    wave::File::File((File *)local_788);
    local_238 = (undefined1  [8])0x0;
    pfStack_230 = (pointer)0x0;
    local_228._M_allocated_capacity = 0;
    EVar7 = wave::File::Open((File *)local_788,&local_648,kIn);
    if (EVar7 == kNoError) {
      EVar7 = wave::File::Read((File *)local_788,(vector<float,_std::allocator<float>_> *)local_238)
      ;
      if (EVar7 == kNoError) {
        pFVar11 = fopen(local_668._M_dataplus._M_p,"wb");
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Converting Orao WAV tape to TAP format.",0x27);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
        std::ostream::put('h');
        std::ostream::flush();
        pfVar5 = pfStack_230;
        auVar4 = local_238;
        fputc(0x4f,pFVar11);
        if ((long)pfVar5 - (long)auVar4 != 0) {
          lVar24 = (long)pfVar5 - (long)auVar4 >> 2;
          bVar6 = 0x4f;
          lVar25 = 0;
          bVar14 = 0;
          bVar28 = false;
          bVar26 = false;
          iVar15 = 0;
          do {
            fVar2 = *(float *)((long)local_238 + lVar25 * 4);
            if (bVar26 == 0.0 < fVar2) {
              iVar19 = iVar15 + 1;
            }
            else {
              iVar19 = 0;
              if (bVar28) {
                bVar28 = false;
              }
              else {
                bVar6 = bVar6 * '\x02' | 10 < iVar15;
                if (bVar14 == 7) {
                  fputc((int)(char)bVar6,pFVar11);
                  bVar28 = true;
                  bVar6 = 0;
                  iVar19 = 0;
                  bVar14 = 0;
                }
                else {
                  bVar14 = bVar14 + 1;
                  bVar28 = true;
                }
              }
            }
            lVar25 = lVar25 + 1;
            bVar26 = 0.0 < fVar2;
            iVar15 = iVar19;
          } while (lVar24 + (ulong)(lVar24 == 0) != lVar25);
          if (bVar14 != 0) {
            if (bVar14 < 7) {
              iVar15 = bVar14 - 7;
              do {
                bVar6 = bVar6 * '\x02';
                iVar15 = iVar15 + 1;
              } while (iVar15 != 0);
            }
LAB_00108683:
            fputc((int)(char)bVar6,pFVar11);
          }
        }
LAB_0010868e:
        fclose(pFVar11);
        uVar20 = 0;
        goto LAB_00108698;
      }
      cVar16 = 'h';
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Something went wrong while reading input file.",0x2e);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
    }
    else {
      cVar16 = -0x58;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Something went wrong while opening input file.",0x2e);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x58);
    }
    std::ostream::put(cVar16);
    uVar20 = 1;
    std::ostream::flush();
LAB_00108698:
    if (local_238 != (undefined1  [8])0x0) {
      operator_delete((void *)local_238,local_228._M_allocated_capacity - (long)local_238);
    }
    this = (_Head_base<0UL,_wave::File::Impl_*,_false> *)local_788;
  }
  else {
    if (bVar29) {
      wave::File::File((File *)local_788);
      local_238 = (undefined1  [8])0x0;
      pfStack_230 = (pointer)0x0;
      local_228._M_allocated_capacity = 0;
      EVar7 = wave::File::Open((File *)local_788,&local_648,kIn);
      if (EVar7 == kNoError) {
        EVar7 = wave::File::Read((File *)local_788,
                                 (vector<float,_std::allocator<float>_> *)local_238);
        if (EVar7 == kNoError) {
          pFVar11 = fopen(local_668._M_dataplus._M_p,"wb");
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Converting Orao WAV tape to old TAP format.",0x2b);
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "WARNING: Header is not formed well, so some emulators may not work.",0x43);
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          pfVar5 = pfStack_230;
          auVar4 = local_238;
          lVar24 = (long)pfStack_230 - (long)local_238;
          fputc(0x68,pFVar11);
          fputc(1,pFVar11);
          fputc(0,pFVar11);
          iVar15 = 0x165;
          do {
            fputc(0,pFVar11);
            iVar15 = iVar15 + -1;
          } while (iVar15 != 0);
          if ((undefined1  [8])pfVar5 != auVar4) {
            lVar24 = lVar24 >> 2;
            lVar25 = 0;
            bVar14 = 0;
            bVar28 = false;
            uVar21 = 0;
            bVar26 = false;
            iVar15 = 0;
            do {
              fVar2 = *(float *)((long)local_238 + lVar25 * 4);
              if (bVar26 == 0.0 < fVar2) {
                iVar19 = iVar15 + 1;
              }
              else {
                iVar19 = 0;
                if (bVar28) {
                  bVar28 = false;
                }
                else {
                  bVar6 = (10 < iVar15) << 7 | (byte)(uVar21 >> 1);
                  uVar21 = (ulong)bVar6;
                  if (bVar14 == 7) {
                    fputc((int)(char)bVar6,pFVar11);
                    bVar28 = true;
                    uVar21 = 0;
                    iVar19 = 0;
                    bVar14 = 0;
                  }
                  else {
                    bVar14 = bVar14 + 1;
                    bVar28 = true;
                  }
                }
              }
              bVar6 = (byte)uVar21;
              lVar25 = lVar25 + 1;
              bVar26 = 0.0 < fVar2;
              iVar15 = iVar19;
            } while (lVar24 + (ulong)(lVar24 == 0) != lVar25);
            if (bVar14 != 0) {
              if (bVar14 < 7) {
                iVar15 = bVar14 - 7;
                do {
                  uVar21 = uVar21 >> 1;
                  bVar6 = (byte)uVar21;
                  iVar15 = iVar15 + 1;
                } while (iVar15 != 0);
              }
              goto LAB_00108683;
            }
          }
          goto LAB_0010868e;
        }
        cVar16 = 'h';
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Something went wrong while reading input file.",0x2e);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
      }
      else {
        cVar16 = -0x58;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Something went wrong while opening input file.",0x2e);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x58);
      }
      std::ostream::put(cVar16);
      uVar20 = 1;
      std::ostream::flush();
      goto LAB_00108698;
    }
    if (!bVar27) {
      if (bVar30) {
        std::ifstream::ifstream(local_238,(string *)&local_648,_S_bin);
        if ((local_238[*(long *)((long)local_238 + -0x18) + 0x20] & 5) == 0) {
          local_788._0_8_ = (Impl *)0x0;
          local_788._8_8_ = (pointer *)0x0;
          local_778._0_8_ = (pointer)0x0;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Converting Orao old TAP tape to new TAP format.",0x2f);
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          std::istream::seekg((long)local_238,_S_beg);
          sVar12 = std::istream::tellg();
          std::istream::seekg((long)local_238,_S_beg);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_788,sVar12);
          std::istream::read(local_238,local_788._0_8_);
          pFVar11 = fopen(local_668._M_dataplus._M_p,"wb");
          fputc(0x4f,pFVar11);
          if (0x168 < (ulong)(local_788._8_8_ - local_788._0_8_)) {
            uVar21 = 0x168;
            do {
              bVar14 = *(byte *)((long)&(((_Vector_impl *)&((string *)local_788._0_8_)->_M_dataplus)
                                        ->super__Vector_impl_data)._M_start + uVar21);
              bVar14 = bVar14 << 4 | bVar14 >> 4;
              bVar14 = bVar14 >> 2 & 0x33 | (bVar14 & 0x33) << 2;
              fputc((int)(char)(bVar14 >> 1 & 0x55 | (bVar14 & 0x55) * '\x02'),pFVar11);
              uVar21 = uVar21 + 1;
            } while (uVar21 < (ulong)(local_788._8_8_ - local_788._0_8_));
          }
          if ((Impl *)local_788._0_8_ != (Impl *)0x0) {
            operator_delete((void *)local_788._0_8_,local_778._0_8_ - local_788._0_8_);
          }
          std::ifstream::~ifstream(local_238);
          goto LAB_0010884a;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Failed to open input file",0x19);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      }
      else {
LAB_0010884a:
        uVar20 = 0;
        if (!bVar31) goto LAB_001086bf;
        std::ifstream::ifstream(local_238,(string *)&local_648,_S_bin);
        if ((local_238[*(long *)((long)local_238 + -0x18) + 0x20] & 5) == 0) {
          local_788._0_8_ = (Impl *)0x0;
          local_788._8_8_ = (pointer *)0x0;
          local_778._0_8_ = (pointer)0x0;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Converting Orao new TAP tape to old TAP format.",0x2f);
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "WARNING: Header is not formed well, so some emulators may not work.",0x43);
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          std::istream::seekg((long)local_238,_S_beg);
          sVar12 = std::istream::tellg();
          std::istream::seekg((long)local_238,_S_beg);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_788,sVar12);
          std::istream::read(local_238,local_788._0_8_);
          pFVar11 = fopen(local_668._M_dataplus._M_p,"wb");
          fputc(0x68,pFVar11);
          fputc(1,pFVar11);
          fputc(0,pFVar11);
          iVar15 = 0x165;
          do {
            fputc(0,pFVar11);
            iVar15 = iVar15 + -1;
          } while (iVar15 != 0);
          if (1 < (ulong)(local_788._8_8_ - local_788._0_8_)) {
            uVar21 = 1;
            do {
              bVar14 = *(byte *)((long)&(((_Vector_impl *)&((string *)local_788._0_8_)->_M_dataplus)
                                        ->super__Vector_impl_data)._M_start + uVar21);
              bVar14 = bVar14 << 4 | bVar14 >> 4;
              bVar14 = bVar14 >> 2 & 0x33 | (bVar14 & 0x33) << 2;
              fputc((int)(char)(bVar14 >> 1 & 0x55 | (bVar14 & 0x55) * '\x02'),pFVar11);
              uVar21 = uVar21 + 1;
            } while (uVar21 < (ulong)(local_788._8_8_ - local_788._0_8_));
          }
          if ((Impl *)local_788._0_8_ != (Impl *)0x0) {
            operator_delete((void *)local_788._0_8_,local_778._0_8_ - local_788._0_8_);
          }
          std::ifstream::~ifstream(local_238);
          uVar20 = 0;
          goto LAB_001086bf;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Failed to open input file",0x19);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      }
      std::ifstream::~ifstream(local_238);
      uVar20 = 1;
      goto LAB_001086bf;
    }
    wave::File::File((File *)&local_688);
    local_788._0_8_ = (Impl *)0x0;
    local_788._8_8_ = (pointer *)0x0;
    local_778._0_8_ = (pointer)0x0;
    EVar7 = wave::File::Open((File *)&local_688,&local_668,kOut);
    if (EVar7 == kNoError) {
      std::ifstream::ifstream(local_238,(string *)&local_648,_S_bin);
      if ((local_238[*(long *)((long)local_238 + -0x18) + 0x20] & 5) == 0) {
        local_5c8._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_5c8._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        stack0xfffffffffffffa48 = (pointer)0x0;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Converting Orao TAP tape to WAV format.",0x27);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        std::istream::seekg((long)local_238,_S_beg);
        lVar24 = std::istream::tellg();
        std::istream::seekg((long)local_238,_S_cur);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_5c8,lVar24 - 1);
        std::istream::read(local_238,local_5c8._0_8_);
        uVar3 = local_5c8._8_8_;
        if (local_5c8._0_8_ != local_5c8._8_8_) {
          pbVar22 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_5c8._0_8_;
          do {
            bVar14 = *(byte *)&(pbVar22->_M_dataplus)._M_p;
            uVar20 = 7;
            do {
              if ((bVar14 >> (uVar20 & 0x1f) & 1) == 0) {
                iVar15 = 9;
                orao_output_wave((vector<float,_std::allocator<float>_> *)local_788,24576.0,9);
              }
              else {
                iVar15 = 0x11;
                orao_output_wave((vector<float,_std::allocator<float>_> *)local_788,24576.0,0x11);
              }
              orao_output_wave((vector<float,_std::allocator<float>_> *)local_788,-24576.0,iVar15);
              bVar26 = uVar20 != 0;
              uVar20 = uVar20 - 1;
            } while (bVar26);
            pbVar22 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&(pbVar22->_M_dataplus)._M_p + 1);
          } while (pbVar22 !=
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar3);
        }
        EVar7 = wave::File::Write((File *)&local_688,
                                  (vector<float,_std::allocator<float>_> *)local_788);
        if (EVar7 != kNoError) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Something went wrong while writing output file.",0x2f);
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        }
        uVar20 = (uint)(EVar7 != kNoError);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5c8._0_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          operator_delete((void *)local_5c8._0_8_,stack0xfffffffffffffa48 - local_5c8._0_8_);
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Failed to open input file",0x19);
        uVar20 = 1;
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      }
      std::ifstream::~ifstream(local_238);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Something went wrong while opening output file.",0x2f);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x58);
      std::ostream::put(-0x58);
      uVar20 = 1;
      std::ostream::flush();
    }
    if ((Impl *)local_788._0_8_ != (Impl *)0x0) {
      operator_delete((void *)local_788._0_8_,local_778._0_8_ - local_788._0_8_);
    }
    this = &local_688;
  }
  wave::File::~File((File *)this);
LAB_001086bf:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_668._M_dataplus._M_p != &local_668.field_2) {
    operator_delete(local_668._M_dataplus._M_p,
                    CONCAT71(local_668.field_2._M_allocated_capacity._1_7_,
                             local_668.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_648._M_dataplus._M_p != &local_648.field_2) {
    operator_delete(local_648._M_dataplus._M_p,
                    CONCAT71(local_648.field_2._M_allocated_capacity._1_7_,
                             local_648.field_2._M_local_buf[0]) + 1);
  }
  return uVar20;
}

Assistant:

int main(int argc, const char* argv[])
{
	std::string input_file;
	std::string output_file;
	bool wav_to_tap = false;
	bool wav_to_oldtap = false;
	bool tap_to_wav = false;
	bool old_to_new = false;
	bool new_to_old = false;
	try
	{
		std::string name = argv[0];
		cxxopts::Options options(name.c_str(), name + " - Orao cassette tape tool");
		options
			.positional_help("[optional args]")
			.show_positional_help();

		options
			.allow_unrecognised_options()
			.add_options()
			("i,input", "Input", cxxopts::value<std::string>())
			("o,output", "Output file", cxxopts::value<std::string>())
			("tap", "Convert WAV to TAP", cxxopts::value<bool>())
			("oldtap", "Convert WAV to oldTAP", cxxopts::value<bool>())
			("wav", "Convert TAP to WAV", cxxopts::value<bool>())
			("old2new", "Convert old TAP to new TAP", cxxopts::value<bool>())
			("new2old", "Convert new TAP to old TAP <WARNING: header will not be good>", cxxopts::value<bool>())
			("help", "Print help")
		;

		options.parse_positional({"input", "output"});

		auto result = options.parse(argc, argv);

		if (result.count("help") || result.arguments().empty())
		{
			std::cout << options.help() << std::endl;
			exit(0);
		}

		if (result.count("input"))
		{
			input_file = result["input"].as<std::string>();
		} else {
			std::cerr << "Input file is mandatory." << std::endl;
			return 1;
		}

		if (result.count("output"))
		{
			output_file = result["output"].as<std::string>();
		} else {
			std::cerr << "Output file is mandatory." << std::endl;	
			return 1;
		}

		if (result.count("wav") && result.count("tap") && result.count("old2new") && result.count("new2old") && result.count("oldtap"))
		{
			std::cerr << "Only one target format is possible." << std::endl;	
			return 1;
		}
		if (!result.count("wav") && !result.count("tap") && !result.count("old2new") && !result.count("new2old") && !result.count("oldtap"))
		{
			std::cerr << "Target format is mandatory." << std::endl;	
			return 1;
		}
		if (result.count("wav")) tap_to_wav = true;
		if (result.count("tap")) wav_to_tap = true;
		if (result.count("oldtap")) wav_to_oldtap = true;
		if (result.count("old2new")) old_to_new = true;
		if (result.count("new2old")) new_to_old = true;

	}
	catch (const cxxopts::OptionException& e)
	{
		std::cerr << "Error parsing options: " << e.what() << std::endl;
		return 1;
	}

	if (wav_to_tap) {
		wave::File read_file;
		std::vector<float> content;	
		wave::Error err = read_file.Open(input_file, wave::kIn);
		if (err) {
			std::cerr << "Something went wrong while opening input file." << std::endl;
			return 1;
		}
		err = read_file.Read(&content);
		if (err) {
			std::cout << "Something went wrong while reading input file." << std::endl;
			return 1;
		}
		FILE *fp = fopen(output_file.c_str(), "wb");

		std::cout << "Converting Orao WAV tape to TAP format." << std::endl;
		size_t numSamples = content.size();
		int cnt = 0;
		bool firstPart = false;
		uint8_t bit = 0;
		uint8_t prevVal = 0;
		uint8_t bitcounter = 0;
		uint8_t data = 0x4f;
		// Make first byte same as in tool from Josip
		fwrite(&data, 1, 1, fp);
		for (size_t i = 0; i < numSamples; i++)
		{
			double currentSample = content[i];
			uint8_t val = (currentSample > 0) ? 1 : 0;
			if (prevVal == val)
				cnt++;
			else {
				bit = (cnt>=12) ? 1 : 0;
				if (!firstPart) {
						bit = (cnt>=11) ? 1 : 0;
						data = (data << 1) | bit;
						if (bitcounter == 7) {
							fwrite(&data, 1, 1, fp);
							data = 0;
							bitcounter = 0;
						} else {
							bitcounter++;
						}
					firstPart = true;
				} else {
					firstPart = false;
				}
				cnt = 0;
			}
			prevVal = val;
		}
		if (bitcounter != 0) {
			for(int i=bitcounter; i<7; i++)
				data = (data << 1);
			fwrite(&data, 1, 1, fp);
		}
		fclose(fp);
		return 0;
	}
	if (wav_to_oldtap) {
		wave::File read_file;
		std::vector<float> content;	
		wave::Error err = read_file.Open(input_file, wave::kIn);
		if (err) {
			std::cerr << "Something went wrong while opening input file." << std::endl;
			return 1;
		}
		err = read_file.Read(&content);
		if (err) {
			std::cout << "Something went wrong while reading input file." << std::endl;
			return 1;
		}
		FILE *fp = fopen(output_file.c_str(), "wb");

		std::cout << "Converting Orao WAV tape to old TAP format." << std::endl;
		std::cout << "WARNING: Header is not formed well, so some emulators may not work." << std::endl;
		size_t numSamples = content.size();
		int cnt = 0;
		bool firstPart = false;
		uint8_t bit = 0;
		uint8_t prevVal = 0;
		uint8_t bitcounter = 0;
		uint8_t data = 0x68; fwrite(&data, 1, 1, fp);
		data = 0x01; fwrite(&data, 1, 1, fp);
		data = 0x00; fwrite(&data, 1, 1, fp);
		for (int i = 0; i < ORAO_HEADER_SIZE -3; i++) {
			fwrite(&data, 1, 1, fp); // fill rest of header with 0
		}
		for (size_t i = 0; i < numSamples; i++)
		{
			double currentSample = content[i];
			uint8_t val = (currentSample > 0) ? 1 : 0;
			if (prevVal == val)
				cnt++;
			else {
				bit = (cnt>=12) ? 1 : 0;
				if (!firstPart) {
						bit = (cnt>=11) ? 0x80 : 0;
						data = (data >> 1) | bit;
						if (bitcounter == 7) {
							fwrite(&data, 1, 1, fp);
							data = 0;
							bitcounter = 0;
						} else {
							bitcounter++;
						}
					firstPart = true;
				} else {
					firstPart = false;
				}
				cnt = 0;
			}
			prevVal = val;
		}
		if (bitcounter != 0) {
			for(int i=bitcounter; i<7; i++)
				data = (data >> 1);
			fwrite(&data, 1, 1, fp);
		}
		fclose(fp);
		return 0;
	}
	if (tap_to_wav) {
		wave::File write_file;
		std::vector<float> content;	
		wave::Error err = write_file.Open(output_file, wave::kOut);
		if (err) {
			std::cerr << "Something went wrong while opening output file." << std::endl;
			return 1;
		}
		std::ifstream fs(input_file, std::ios_base::binary);
		if (!fs) {
			std::cerr << "Failed to open input file" << std::endl;
			return 1;
		}
		std::vector<uint8_t> bytes; 
		std::cout << "Converting Orao TAP tape to WAV format." << std::endl;
		fs.seekg(0, fs.end);
		size_t length = size_t(fs.tellg())-1;
		fs.seekg(1, fs.beg);
		bytes.resize(length);
		fs.read(reinterpret_cast<char *>(&(bytes[0])), length);
		for(uint8_t byte : bytes) {
			for (int j=0;j<8;j++) {
				uint8_t b = (byte >> (7-j)) & 1;
				if (b==0) {
					orao_output_wave(&content, WAVE_LOW , ORAO_WAVE_ZERO);
					orao_output_wave(&content, WAVE_HIGH, ORAO_WAVE_ZERO);
				} else {
					orao_output_wave(&content, WAVE_LOW,  ORAO_WAVE_ONE);
					orao_output_wave(&content, WAVE_HIGH, ORAO_WAVE_ONE);
				}
			}
		}
		err = write_file.Write(content);
		if (err) {
			std::cout << "Something went wrong while writing output file." << std::endl;
			return 1;
		}
		return 0;
	}
	if (old_to_new) {
		std::ifstream fs(input_file, std::ios_base::binary);
		if (!fs) {
			std::cerr << "Failed to open input file" << std::endl;
			return 1;
		}
		std::vector<uint8_t> bytes; 
		std::cout << "Converting Orao old TAP tape to new TAP format." << std::endl;
		fs.seekg(0, fs.end);
		size_t length = size_t(fs.tellg());
		fs.seekg(0, fs.beg);
		bytes.resize(length);
		fs.read(reinterpret_cast<char *>(&(bytes[0])), length);
		FILE *fp = fopen(output_file.c_str(), "wb");
		uint8_t data = 0x4f;
		// Make first byte same as in tool from Josip
		fwrite(&data, 1, 1, fp);
		for (int i = ORAO_HEADER_SIZE; i < bytes.size(); i++) {
			data = reverse(bytes[i]);
			fwrite(&data, 1, 1, fp);
		}
	}
	if (new_to_old) {
		std::ifstream fs(input_file, std::ios_base::binary);
		if (!fs) {
			std::cerr << "Failed to open input file" << std::endl;
			return 1;
		}
		std::vector<uint8_t> bytes; 
		std::cout << "Converting Orao new TAP tape to old TAP format." << std::endl;
		std::cout << "WARNING: Header is not formed well, so some emulators may not work." << std::endl;
		fs.seekg(0, fs.end);
		size_t length = size_t(fs.tellg());
		fs.seekg(0, fs.beg);
		bytes.resize(length);
		fs.read(reinterpret_cast<char *>(&(bytes[0])), length);
		FILE *fp = fopen(output_file.c_str(), "wb");
		uint8_t data = 0x68; fwrite(&data, 1, 1, fp);
		data = 0x01; fwrite(&data, 1, 1, fp);
		data = 0x00; fwrite(&data, 1, 1, fp);
		for (int i = 0; i < ORAO_HEADER_SIZE -3; i++) {
			fwrite(&data, 1, 1, fp); // fill rest of header with 0
		}
		for (int i = 1; i < bytes.size(); i++) {
			data = reverse(bytes[i]);
			fwrite(&data, 1, 1, fp);
		}
	}
	return 0;
}